

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usrsubr.c
# Opt level: O0

int UserSubr(int user_subr_index,int num_args,uint *args)

{
  uint local_28;
  int i;
  int result;
  uint *args_local;
  int num_args_local;
  int user_subr_index_local;
  
  printf("debug: case: 0x%x, args: 0x%x\n",(ulong)(uint)user_subr_index,(ulong)(uint)num_args);
  for (local_28 = 0; (int)local_28 < num_args; local_28 = local_28 + 1) {
    printf("debug: arg[%d]: 0x%x\n",(ulong)local_28,(ulong)args[(int)local_28]);
  }
  if (user_subr_index == 0) {
    printf("sample UFN\n");
    num_args_local = *args;
  }
  else {
    num_args_local = -1;
  }
  return num_args_local;
}

Assistant:

int UserSubr(int user_subr_index, int num_args, unsigned *args) {
  int result = 0;

  /* *** remove the printf when finished debugging your user subr *** */

  printf("debug: case: 0x%x, args: 0x%x\n", user_subr_index, num_args);
  {
    int i;
    for (i = 0; i < num_args; i++) printf("debug: arg[%d]: 0x%x\n", i, args[i]);
  }

  switch (user_subr_index) {
    case 0:
      printf("sample UFN\n");
      result = args[0];
      break;
  default:
      return (-1); /* DO UFN */
  }

  return (result);
}